

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall
SQCompilation::CodegenVisitor::visitRootTableAccessExpr
          (CodegenVisitor *this,RootTableAccessExpr *expr)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_10;
  undefined1 local_c;
  undefined1 local_b;
  undefined2 local_a;
  
  maybeAddInExprLine(this,&expr->super_Expr);
  this_00 = this->_fs;
  SVar1 = SQFuncState::PushTarget(this_00,-1);
  local_c = 0x1f;
  local_b = (undefined1)SVar1;
  local_10._arg1 = 0;
  local_a = 0;
  SQFuncState::AddInstruction(this_00,(SQInstruction *)&local_10);
  return;
}

Assistant:

void CodegenVisitor::visitRootTableAccessExpr(RootTableAccessExpr *expr) {
    maybeAddInExprLine(expr);
    _fs->AddInstruction(_OP_LOADROOT, _fs->PushTarget());
}